

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_delimiters_6(void)

{
  run("delimiters set in a partial should not affect the parent template",
      "[ {{>include}} ]\n[ .{{value}}.  .|value|. ]\n","{\"value\": \"yes\"}",
      "{\"include\": \".{{value}}. {{= | | =}} .|value|.\"}",
      "[ .yes.  .yes. ]\n[ .yes.  .|value|. ]\n");
  return;
}

Assistant:

static void
test_delimiters_6(void)
{
    run(
        "delimiters set in a partial should not affect the parent template",
        "[ {{>include}} ]\n[ .{{value}}.  .|value|. ]\n",
        "{\"value\": \"yes\"}",
        "{\"include\": \".{{value}}. {{= | | =}} .|value|.\"}",
        "[ .yes.  .yes. ]\n[ .yes.  .|value|. ]\n"
    );
}